

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

void addDataTypeNode(UA_Server *server,char *name,UA_UInt32 datatypeid,UA_Boolean isAbstract,
                    UA_UInt32 parent)

{
  void *pvVar1;
  UA_Node *node;
  UA_AddNodesResult res;
  UA_NodeId local_50;
  UA_Server *local_38;
  
  local_38 = server;
  pvVar1 = calloc(1,0xa0);
  if (pvVar1 == (void *)0x0) {
    pvVar1 = (void *)0x0;
  }
  else {
    *(undefined4 *)((long)pvVar1 + 0x20) = 0x40;
  }
  node = (UA_Node *)((long)pvVar1 + 8);
  if (pvVar1 == (void *)0x0) {
    node = (UA_Node *)0x0;
  }
  copyNames(node,name);
  (node->nodeId).identifier.numeric = datatypeid;
  *(UA_Boolean *)&node[1].nodeId.namespaceIndex = isAbstract;
  local_50.namespaceIndex = 0;
  local_50.identifierType = UA_NODEIDTYPE_NUMERIC;
  res.statusCode = 0;
  res._4_4_ = 0;
  res.addedNodeId.namespaceIndex = 0;
  res.addedNodeId._2_2_ = 0;
  res.addedNodeId.identifierType = UA_NODEIDTYPE_NUMERIC;
  res.addedNodeId.identifier.string.length = 0;
  local_50.identifier.numeric = parent;
  Service_AddNodes_existing
            (local_38,&adminSession,node,&local_50,&nodeIdHasSubType,&UA_NODEID_NULL,
             (UA_InstantiationCallback *)0x0,(UA_NodeId *)&res);
  return;
}

Assistant:

static void
addDataTypeNode(UA_Server *server, char* name, UA_UInt32 datatypeid,
                UA_Boolean isAbstract, UA_UInt32 parent) {
    UA_DataTypeNode *datatype = UA_NodeStore_newDataTypeNode();
    copyNames((UA_Node*)datatype, name);
    datatype->nodeId.identifier.numeric = datatypeid;
    datatype->isAbstract = isAbstract;
    addNodeInternal(server, (UA_Node*)datatype,
                    UA_NODEID_NUMERIC(0, parent), nodeIdHasSubType);
}